

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Snapshot.cpp
# Opt level: O0

void __thiscall OpenMD::Snapshot::setBoundingBox(Snapshot *this,Mat3x3d *m)

{
  long in_RDI;
  SquareMatrix3<double> *this_00;
  SquareMatrix3<double> *in_stack_00000018;
  SquareMatrix3<double> *in_stack_ffffffffffffff78;
  
  this_00 = (SquareMatrix3<double> *)(in_RDI + 0x5e0);
  SquareMatrix3<double>::operator=(this_00,in_stack_ffffffffffffff78);
  SquareMatrix3<double>::inverse(in_stack_00000018);
  SquareMatrix3<double>::operator=(this_00,in_stack_ffffffffffffff78);
  SquareMatrix3<double>::~SquareMatrix3((SquareMatrix3<double> *)0x1fcabd);
  *(undefined1 *)(in_RDI + 0xa8d) = 1;
  return;
}

Assistant:

void Snapshot::setBoundingBox(const Mat3x3d& m) {
    frameData.bBox    = m;
    frameData.invBbox = frameData.bBox.inverse();
    hasBoundingBox    = true;
  }